

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

type_t pugi::impl::anon_unknown_0::xpath_sort
                 (xpath_node *begin,xpath_node *end,type_t type,bool rev)

{
  type_t tVar1;
  document_order_comparator local_29;
  type_t local_28;
  type_t local_24;
  type_t sorted;
  type_t order;
  bool rev_local;
  xpath_node *pxStack_18;
  type_t type_local;
  xpath_node *end_local;
  xpath_node *begin_local;
  
  local_24 = type_sorted;
  if (rev) {
    local_24 = type_sorted_reverse;
  }
  sorted._3_1_ = rev;
  tVar1 = type;
  pxStack_18 = end;
  end_local = begin;
  if ((type == type_unsorted) &&
     (order = type, local_28 = xpath_get_order(begin,end), tVar1 = local_28,
     local_28 == type_unsorted)) {
    (anonymous_namespace)::
    sort<pugi::xpath_node*,pugi::impl::(anonymous_namespace)::document_order_comparator>
              (end_local,pxStack_18,&local_29);
    order = type_sorted;
    tVar1 = order;
  }
  order = tVar1;
  if (order != local_24) {
    (anonymous_namespace)::reverse<pugi::xpath_node*>(end_local,pxStack_18);
  }
  return local_24;
}

Assistant:

PUGI__FN xpath_node_set::type_t xpath_sort(xpath_node* begin, xpath_node* end, xpath_node_set::type_t type, bool rev)
	{
		xpath_node_set::type_t order = rev ? xpath_node_set::type_sorted_reverse : xpath_node_set::type_sorted;

		if (type == xpath_node_set::type_unsorted)
		{
			xpath_node_set::type_t sorted = xpath_get_order(begin, end);

			if (sorted == xpath_node_set::type_unsorted)
			{
				sort(begin, end, document_order_comparator());

				type = xpath_node_set::type_sorted;
			}
			else
				type = sorted;
		}

		if (type != order) reverse(begin, end);

		return order;
	}